

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

bool __thiscall position::gives_check(position *this,Move *m)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  unsigned_long *puVar9;
  int iVar10;
  byte bVar11;
  bool bVar12;
  Color them;
  Color c;
  Square target;
  Color local_68;
  Color local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  Square local_34;
  
  local_64 = (this->ifo).stm;
  local_58 = (ulong)local_64;
  uVar3 = local_58 ^ 1;
  local_68 = (Color)uVar3;
  bVar1 = m->type;
  if ((0xf < bVar1) || (bVar12 = true, (0x800fU >> (bVar1 & 0x1f) & 1) == 0)) {
    bVar12 = (bVar1 & 0xfc) == 4;
  }
  bVar11 = (byte)(0x2300 >> (bVar1 & 0x1f)) & bVar1 < 0xe;
  bVar6 = m->f;
  uVar7 = (ulong)bVar6;
  local_40 = (ulong)(this->pcs).piece_on._M_elems[uVar7];
  if ((~bVar11 & local_40 == 5) != 0) {
    return false;
  }
  bVar5 = m->t;
  if (bVar11 == 0) {
    uVar7 = ((&bitboards::squares)[bVar5] | (&bitboards::squares)[uVar7]) ^
            (this->pcs).bitmap._M_elems[local_58]._M_elems[local_40];
    (this->pcs).bitmap._M_elems[local_58]._M_elems[local_40] = uVar7;
    if (!bVar12) goto LAB_00121d51;
    puVar4 = &bitboards::squares + bVar5;
    puVar9 = (this->pcs).bitmap._M_elems[local_58]._M_elems + local_40;
  }
  else {
    if (local_58 == 1) {
      uVar7 = 0x38;
      if (bVar1 == 8) {
        uVar7 = 0x3f;
      }
      bVar5 = (bVar1 == 8) * '\x02' + 0x3b;
    }
    else if (local_64 == white) {
      uVar7 = 7;
      if (bVar1 != 8) {
        uVar7 = 0;
      }
      bVar5 = (bVar1 == 8) * '\x02' + 3;
    }
    bVar6 = (byte)uVar7;
    uVar7 = (&bitboards::squares)[bVar5] | (&bitboards::squares)[uVar7];
    puVar4 = (this->pcs).bitmap._M_elems[local_58]._M_elems + 3;
    puVar9 = puVar4;
  }
  *puVar9 = uVar7 ^ *puVar4;
LAB_00121d51:
  bVar8 = bVar1 == 0xc | bVar1 < 0x11 & (byte)(0x108f0 >> (bVar1 & 0x1f));
  local_48 = 7;
  local_50 = 0x41;
  local_60 = 7;
  if (bVar8 == 1) {
    iVar10 = 0;
    if (bVar1 == 0xc) {
      iVar10 = (uint)(local_58 != 0) * 0x10 + -8;
    }
    local_50 = (ulong)(iVar10 + (uint)bVar5);
    local_60 = (ulong)(this->pcs).piece_on._M_elems[local_50];
    puVar4 = (this->pcs).bitmap._M_elems[uVar3]._M_elems + local_60;
    *puVar4 = *puVar4 ^ (&bitboards::squares)[local_50];
  }
  if (bVar12) {
    if ((bVar1 - 3 & 0xfb) == 0) {
      local_48 = 1;
    }
    if ((bVar1 | 4) == 6) {
      local_48 = 2;
    }
    if ((bVar1 | 4) == 5) {
      local_48 = 3;
    }
    if ((bVar1 & 0xfb) == 0) {
      local_48 = 4;
    }
    puVar4 = (this->pcs).bitmap._M_elems[local_58]._M_elems + local_48;
    *puVar4 = *puVar4 | (&bitboards::squares)[bVar5];
  }
  local_34 = (this->ifo).ks[uVar3];
  bVar2 = is_attacked(this,&local_34,&local_68,&local_64,
                      ((this->pcs).bycolor._M_elems[1] | (this->pcs).bycolor._M_elems[0]) ^
                      (&bitboards::squares)[bVar6] | (&bitboards::squares)[bVar5]);
  uVar7 = (&bitboards::squares)[bVar6] | (&bitboards::squares)[bVar5];
  if (bVar11 == 0) {
    puVar4 = (this->pcs).bitmap._M_elems[local_58]._M_elems + local_40;
    *puVar4 = *puVar4 ^ uVar7;
    if (bVar8 != 0) {
      puVar4 = (this->pcs).bitmap._M_elems[uVar3]._M_elems + local_60;
      *puVar4 = *puVar4 | (&bitboards::squares)[local_50];
    }
    if (!bVar12) {
      return bVar2;
    }
    uVar7 = (&bitboards::squares)[bVar5];
    puVar4 = (this->pcs).bitmap._M_elems[local_58]._M_elems + local_48;
  }
  else {
    puVar4 = (this->pcs).bitmap._M_elems[local_58]._M_elems + 3;
  }
  *puVar4 = *puVar4 ^ uVar7;
  return bVar2;
}

Assistant:

bool position::gives_check(const Move& m) {
	// Note: assumes the input move is legal (!)
	auto mask = 0ULL;
	auto c = to_move();
	auto them = Color(c ^ 1);
	auto isCapture = m.type == Movetype::capture ||
		m.type == Movetype::capture_promotion ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n ||
		m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r;
	auto isPromotion = is_promotion(m.type);
	auto isEp = m.type == Movetype::ep;
	auto isQuiet = m.type == Movetype::quiet;
	auto isCastles = m.type == Movetype::castles ||
		m.type == Movetype::castle_ks ||
		m.type == Movetype::castle_qs;
	auto from = m.f;
	auto to = m.t;
	auto capSq = Square::no_square;
	auto promotePiece = Piece::no_piece;
	auto piece = piece_on(Square(from));
	auto capPiece = Piece::no_piece;
	if (piece == king && !isCastles)
		return false;

	// Move our piece
	if (isCastles) {
		if (c == white) {
			to = (m.type == Movetype::castle_ks ? F1 : D1);
			from = (m.type == Movetype::castle_ks ? H1 : A1);
		}
		else if (c == black) {
			to = (m.type == Movetype::castle_ks ? F8 : D8);
			from = (m.type == Movetype::castle_ks ? H8 : A8);
		}
		pcs.bitmap[c][rook] ^= (bitboards::squares[from] | bitboards::squares[to]);
	}
	else {
		pcs.bitmap[c][piece] ^= (bitboards::squares[from] | bitboards::squares[to]);
		if (isPromotion)
			pcs.bitmap[c][piece] ^= bitboards::squares[to];
	}

	// Remove the captured piece
	if (isCapture || isEp) {
		if (isEp)
			capSq = Square(to + (c == white ? -8 : 8));
		else
			capSq = Square(to);

		capPiece = piece_on(Square(capSq));
		pcs.bitmap[them][capPiece] ^= bitboards::squares[capSq];
		mask ^= bitboards::squares[capSq];
	}

	// Add promotion piece
	if (isPromotion) {
		if (m.type == Movetype::capture_promotion_n || m.type == Movetype::promotion_n)
			promotePiece = knight;
		if (m.type == Movetype::capture_promotion_b || m.type == Movetype::promotion_b)
			promotePiece = bishop;
		if (m.type == Movetype::capture_promotion_r || m.type == Movetype::promotion_r)
			promotePiece = rook;
		if (m.type == Movetype::capture_promotion_q || m.type == Movetype::promotion_q)
			promotePiece = queen;
		pcs.bitmap[c][promotePiece] |= bitboards::squares[to];
	}

	// Make the check mask
	mask = (all_pieces() ^ bitboards::squares[from]) | bitboards::squares[to];

	auto target = king_square(them);
	auto checks = is_attacked(target, them, c, mask);

	// Reset the pcs bitmap
	if (isCastles) {
		pcs.bitmap[c][rook] ^= (bitboards::squares[to] | bitboards::squares[from]);
	}
	else {
		// Move our piece back
		pcs.bitmap[c][piece] ^= (bitboards::squares[to] | bitboards::squares[from]);

		// Place back the captured piece and remove promotion piece
		if (isCapture || isEp)
			pcs.bitmap[them][capPiece] |= bitboards::squares[capSq];
		if (isPromotion) {
			pcs.bitmap[c][promotePiece] ^= bitboards::squares[to];
		}
	}

	return checks;
}